

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

_Bool get_item_action(menu_conflict2 *menu,ui_event *event,wchar_t oid)

{
  object *obj;
  char cVar1;
  uchar ch;
  _Bool _Var2;
  void *pvVar3;
  uint uVar4;
  wchar_t mode;
  _Bool is_harmless;
  char key;
  object_menu_data *choice;
  wchar_t oid_local;
  ui_event *event_local;
  menu_conflict2 *menu_local;
  
  pvVar3 = menu_priv((menu_conflict *)menu);
  cVar1 = (char)(event->key).code;
  uVar4 = item_mode & 0x10;
  if ((event->type == EVT_SELECT) && (*(long *)((long)pvVar3 + (long)oid * 0x100 + 0xa0) != 0)) {
    obj = *(object **)((long)pvVar3 + (long)oid * 0x100 + 0xa0);
    ch = cmd_lookup_key(item_cmd,(uint)(((player->opts).opt[1] & 1U) != 0));
    _Var2 = get_item_allow(obj,ch,item_cmd,uVar4 != 0);
    if (_Var2) {
      selection = *(object **)((long)pvVar3 + (long)oid * 0x100 + 0xa0);
    }
  }
  if (event->type == EVT_KBRD) {
    if (cVar1 == '/') {
      if ((((item_mode & 2U) == 0) && ((allow_all & 1U) == 0)) ||
         (player->upkeep->command_wrk == L'\x02')) {
        if ((((item_mode & 1U) == 0) && ((allow_all & 1U) == 0)) ||
           (player->upkeep->command_wrk == L'\x01')) {
          bell();
        }
        else {
          player->upkeep->command_wrk = L'\x01';
          newmenu = true;
        }
      }
      else {
        player->upkeep->command_wrk = L'\x02';
        newmenu = true;
      }
    }
    else if (cVar1 == '|') {
      if ((q2 < q1) && ((allow_all & 1U) == 0)) {
        bell();
      }
      else {
        player->upkeep->command_wrk = L'\b';
        newmenu = true;
      }
    }
    else if (cVar1 == '-') {
      if ((f2 < f1) && ((allow_all & 1U) == 0)) {
        bell();
      }
      else {
        player->upkeep->command_wrk = L'\x04';
        newmenu = true;
      }
    }
  }
  return false;
}

Assistant:

static bool get_item_action(struct menu *menu, const ui_event *event, int oid)
{
	struct object_menu_data *choice = menu_priv(menu);
	char key = event->key.code;
	bool is_harmless = item_mode & IS_HARMLESS ? true : false;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	if (event->type == EVT_SELECT) {
		if (choice[oid].object && get_item_allow(choice[oid].object, cmd_lookup_key(item_cmd, mode),
						   item_cmd, is_harmless))
			selection = choice[oid].object;
	}

	if (event->type == EVT_KBRD) {
		if (key == '/') {
			/* Toggle if allowed */
			if (((item_mode & USE_INVEN) || allow_all)
				&& (player->upkeep->command_wrk != USE_INVEN)) {
				player->upkeep->command_wrk = USE_INVEN;
				newmenu = true;
			} else if (((item_mode & USE_EQUIP) || allow_all) &&
					   (player->upkeep->command_wrk != USE_EQUIP)) {
				player->upkeep->command_wrk = USE_EQUIP;
				newmenu = true;
			} else {
				bell();
			}
		}

		else if (key == '|') {
			/* No toggle allowed */
			if ((q1 > q2) && !allow_all){
				bell();
			} else {
				/* Toggle to quiver */
				player->upkeep->command_wrk = (USE_QUIVER);
				newmenu = true;
			}
		}

		else if (key == '-') {
			/* No toggle allowed */
			if ((f1 > f2) && !allow_all) {
				bell();
			} else {
				/* Toggle to floor */
				player->upkeep->command_wrk = (USE_FLOOR);
				newmenu = true;
			}
		}
	}

	return false;
}